

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void destroy_free<lda>(void *temp)

{
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)((long)temp + 0x160));
  if (*(void **)((long)temp + 0x148) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x148));
  }
  if (*(void **)((long)temp + 0x128) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x128));
  }
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}